

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server-ws.c
# Opt level: O0

int lws_parse_ws(lws *wsi,uchar **buf,size_t len)

{
  uchar *puVar1;
  uchar *puVar2;
  int iVar3;
  bool bVar4;
  uint8_t *bin;
  int bulk;
  int m;
  uchar *bufin;
  size_t len_local;
  uchar **buf_local;
  lws *wsi_local;
  
  puVar1 = *buf;
  _lws_log(0x10,"%s: received %d byte packet\n","lws_parse_ws",len & 0xffffffff);
  bufin = (uchar *)len;
  do {
    bin._0_4_ = 0;
    if (bufin == (uchar *)0x0) {
      _lws_log(0x10,"%s: exit with %d unused\n","lws_parse_ws",0);
      return 0;
    }
    if (wsi->rxflow_bitmap != '\0') {
      _lws_log(8,"%s: doing rxflow, caching %d\n","lws_parse_ws",(ulong)bufin & 0xffffffff);
      iVar3 = lws_rxflow_cache(wsi,*buf,0,(int)bufin);
      if (iVar3 == 2) {
        _lws_log(8,"%s: trimming inside rxflow cache\n","lws_parse_ws");
        *buf = puVar1;
      }
      else {
        *buf = bufin + (long)*buf;
      }
      return 1;
    }
    while( true ) {
      bVar4 = false;
      if ((wsi->lws_rx_parse_state == '\x14') &&
         (((wsi->ws->opcode == '\x01' || (wsi->ws->opcode == '\x02')) ||
          (bVar4 = false, wsi->ws->opcode == '\0')))) {
        bVar4 = bufin != (uchar *)0x0;
      }
      if (!bVar4) break;
      puVar2 = *buf;
      bin._0_4_ = 1;
      iVar3 = lws_ws_frame_rest_is_payload(wsi,buf,(size_t)bufin);
      if ((int)bufin < (int)*buf - (int)puVar2) {
        __assert_fail("(int)lws_ptr_diff(*buf, bin) <= (int)len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/server-ws.c"
                      ,0x3ce,"int lws_parse_ws(struct lws *, unsigned char **, size_t)");
      }
      bufin = bufin + -(long)((int)*buf - (int)puVar2);
      if (iVar3 == 0) break;
      if (iVar3 < 0) {
        _lws_log(8,"%s: rest_is_payload bailed\n","lws_parse_ws");
        return -1;
      }
    }
    if ((uint)bin == 0) {
      puVar2 = *buf;
      *buf = puVar2 + 1;
      bin._4_4_ = lws_ws_rx_sm(wsi,'\0',*puVar2);
      bufin = bufin + -1;
    }
    else {
      bin._4_4_ = lws_ws_rx_sm(wsi,'\x03','\0');
    }
    if (bin._4_4_ < 0) {
      _lws_log(8,"%s: lws_ws_rx_sm bailed %d\n","lws_parse_ws",(ulong)(uint)bin);
      return -1;
    }
  } while( true );
}

Assistant:

int
lws_parse_ws(struct lws *wsi, unsigned char **buf, size_t len)
{
	unsigned char *bufin = *buf;
	int m, bulk = 0;

	lwsl_debug("%s: received %d byte packet\n", __func__, (int)len);

	//lwsl_hexdump_notice(*buf, len);

	/* let the rx protocol state machine have as much as it needs */

	while (len) {
		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (wsi->rxflow_bitmap) {
			lwsl_info("%s: doing rxflow, caching %d\n", __func__,
				(int)len);
			/*
			 * Since we cached the remaining available input, we
			 * can say we "consumed" it.
			 *
			 * But what about the case where the available input
			 * came out of the rxflow cache already?  If we are
			 * effectively "putting it back in the cache", we have
			 * leave it where it is, already pointed to by the head.
			 */
			if (lws_rxflow_cache(wsi, *buf, 0, (int)len) ==
							LWSRXFC_TRIMMED) {
				/*
				 * We dealt with it by trimming the existing
				 * rxflow cache HEAD to account for what we used.
				 *
				 * indicate we didn't use anything to the caller
				 * so he doesn't do any consumed processing
				 */
				lwsl_info("%s: trimming inside rxflow cache\n",
					  __func__);
				*buf = bufin;
			} else
				*buf += len;

			return 1;
		}
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			lwsl_debug("%s: draining rx ext\n", __func__);
			m = lws_ws_rx_sm(wsi, ALREADY_PROCESSED_IGNORE_CHAR, 0);
			if (m < 0)
				return -1;
			continue;
		}
#endif

		/* consume payload bytes efficiently */
		while (wsi->lws_rx_parse_state == LWS_RXPS_WS_FRAME_PAYLOAD &&
				(wsi->ws->opcode == LWSWSOPC_TEXT_FRAME ||
				 wsi->ws->opcode == LWSWSOPC_BINARY_FRAME ||
				 wsi->ws->opcode == LWSWSOPC_CONTINUATION) &&
		       len) {
			uint8_t *bin = *buf;

			bulk = 1;
			m = lws_ws_frame_rest_is_payload(wsi, buf, len);
			assert((int)lws_ptr_diff(*buf, bin) <= (int)len);
			len -= lws_ptr_diff(*buf, bin);

			if (!m) {

				break;
			}
			if (m < 0) {
				lwsl_info("%s: rest_is_payload bailed\n",
					  __func__);
				return -1;
			}
		}

		if (!bulk) {
			/* process the byte */
			m = lws_ws_rx_sm(wsi, 0, *(*buf)++);
			len--;
		} else {
			/*
			 * We already handled this byte in bulk, just deal
			 * with the ramifications
			 */
#if !defined(LWS_WITHOUT_EXTENSIONS)
			lwsl_debug("%s: coming out of bulk with len %d, "
				   "wsi->ws->rx_draining_ext %d\n",
				   __func__, (int)len,
				   wsi->ws->rx_draining_ext);
#endif
			m = lws_ws_rx_sm(wsi, ALREADY_PROCESSED_IGNORE_CHAR |
					      ALREADY_PROCESSED_NO_CB, 0);
		}

		if (m < 0) {
			lwsl_info("%s: lws_ws_rx_sm bailed %d\n", __func__,
				  bulk);

			return -1;
		}

		bulk = 0;
	}

	lwsl_debug("%s: exit with %d unused\n", __func__, (int)len);

	return 0;
}